

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall
pstore::file::in_memory::write_buffer(in_memory *this,not_null<const_void_*> ptr,size_t nbytes)

{
  ulong uVar1;
  ulong uVar2;
  span<const_unsigned_char,__1L> src_span;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_80;
  span<unsigned_char,__1L> local_70;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_50;
  span<unsigned_char,__1L> dest_span;
  
  check_writable(this);
  uVar2 = this->length_;
  uVar1 = this->pos_;
  if (uVar2 <= uVar1) {
    assert_failed("length_ > pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xd5);
  }
  if (uVar2 - uVar1 < nbytes) {
    raise<std::errc>(invalid_argument);
  }
  if ((long)(uVar2 | nbytes | uVar1) < 0) {
    assert_failed("length_ <= max && pos_ <= max && nbytes <= max",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xe1);
  }
  src_span.storage_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       gsl::make_span<unsigned_char>
                 ((this->buffer_).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,uVar2);
  dest_span = gsl::span<unsigned_char,_-1L>::subspan
                        ((span<unsigned_char,__1L> *)&src_span,this->pos_,nbytes);
  src_span = gsl::make_span<unsigned_char_const>((uchar *)ptr.ptr_,nbytes);
  gsl::span<const_unsigned_char,_-1L>::begin((span<const_unsigned_char,__1L> *)&local_50);
  gsl::span<const_unsigned_char,_-1L>::end((span<const_unsigned_char,__1L> *)&local_60);
  gsl::span<unsigned_char,_-1L>::begin(&local_70);
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char_const,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
            (&local_80,&local_50,&local_60);
  uVar2 = nbytes + this->pos_;
  if (!CARRY8(nbytes,this->pos_)) {
    this->pos_ = uVar2;
    if (this->eof_ < uVar2) {
      this->eof_ = uVar2;
    }
    return;
  }
  assert_failed("pos_ + nbytes >= pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                ,0xee);
}

Assistant:

void in_memory::write_buffer (gsl::not_null<void const *> const ptr,
                                      std::size_t const nbytes) {
            this->check_writable ();
            PSTORE_ASSERT (length_ > pos_);
            if (nbytes > length_ - pos_) {
                raise (std::errc::invalid_argument);
            }

            using element_type = decltype (buffer_)::element_type;
            using index_type = gsl::span<element_type>::index_type;
#ifndef NDEBUG
            {
                // TODO: if nbytes > index_type max if would be much better to split the
                // write into two pieces rather than just fail...
                constexpr auto max = std::numeric_limits<index_type>::max ();
                PSTORE_ASSERT (length_ <= max && pos_ <= max && nbytes <= max);
            }
#endif
            auto dest_span =
                gsl::make_span (buffer_.get (), static_cast<index_type> (length_))
                    .subspan (static_cast<index_type> (pos_), static_cast<index_type> (nbytes));
            auto src_span = gsl::make_span (static_cast<element_type const *> (ptr.get ()),
                                            static_cast<index_type> (nbytes));

            static_assert (std::is_same<decltype (src_span)::index_type, index_type>::value,
                           "expected index_type of src_span and dest_span to be the same");

            std::copy (std::begin (src_span), std::end (src_span), std::begin (dest_span));
            PSTORE_ASSERT (pos_ + nbytes >= pos_);
            pos_ += nbytes;
            if (pos_ > eof_) {
                eof_ = pos_;
            }
        }